

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Entity::to_bytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
                Entity *this)

{
  uint8_t uVar1;
  uint8_t uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint16_t uVar8;
  Entity *entity;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  initializer_list<unsigned_char> __l;
  allocator_type local_41;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  byte local_38;
  byte local_37;
  byte local_36;
  byte local_35;
  byte local_34;
  uint8_t local_33;
  byte local_32;
  undefined1 local_31;
  
  bVar11 = (this->_attrs).position.x;
  bVar12 = (this->_attrs).position.y;
  uVar1 = (this->_attrs).orientation;
  uVar2 = (this->_attrs).palette;
  bVar13 = (this->_attrs).speed;
  bVar3 = (this->_attrs).fightable;
  bVar4 = (this->_attrs).liftable;
  bVar5 = (this->_attrs).talkable;
  bVar6 = (this->_attrs).flag_unknown_2_4;
  bVar7 = (this->_attrs).flag_unknown_2_3;
  entity = (this->_attrs).entity_to_use_tiles_from;
  local_40 = __return_storage_ptr__;
  if (entity == (Entity *)0x0) {
    bVar10 = 0;
  }
  else {
    bVar10 = Map::entity_id(entity->_map,entity);
    bVar10 = bVar10 & 0xf;
  }
  pvVar9 = local_40;
  bVar13 = bVar13 & 7;
  bVar14 = bVar13 | 0x80;
  if (bVar3 == false) {
    bVar14 = bVar13;
  }
  bVar13 = bVar14 + 0x40;
  if (bVar4 == false) {
    bVar13 = bVar14;
  }
  bVar14 = bVar13 | 0x20;
  if (bVar5 == false) {
    bVar14 = bVar13;
  }
  bVar13 = bVar14 | 0x10;
  if (bVar6 == false) {
    bVar13 = bVar14;
  }
  local_36 = bVar13 | 8;
  if (bVar7 == false) {
    local_36 = bVar13;
  }
  local_37 = uVar2 << 6 | bVar12 & 0x3f;
  local_38 = uVar1 << 6 | bVar11 & 0x3f;
  bVar11 = bVar10 | 0x80;
  if ((this->_attrs).position.half_x == false) {
    bVar11 = bVar10;
  }
  bVar12 = bVar11 + 0x40;
  if ((this->_attrs).position.half_y == false) {
    bVar12 = bVar11;
  }
  bVar11 = bVar12 | 0x20;
  if ((this->_attrs).flag_unknown_3_5 == false) {
    bVar11 = bVar12;
  }
  local_35 = bVar11 | 0x10;
  if (entity == (Entity *)0x0) {
    local_35 = bVar11;
  }
  uVar8 = (this->_attrs).behavior_id;
  local_34 = (byte)(uVar8 >> 8) & 3 | (this->_attrs).dialogue << 2;
  bVar12 = (this->_attrs).position.z & 0xf;
  bVar11 = bVar12 | 0x10;
  if ((this->_attrs).can_pass_through == false) {
    bVar11 = bVar12;
  }
  bVar12 = bVar11 + 0x20;
  if ((this->_attrs).appear_after_player_moved_away == false) {
    bVar12 = bVar11;
  }
  local_33 = (this->_attrs).type_id;
  bVar11 = bVar12 | 0x40;
  if ((this->_attrs).position.half_z == false) {
    bVar11 = bVar12;
  }
  local_32 = bVar11 | 0x80;
  if ((this->_attrs).gravity_immune == false) {
    local_32 = bVar11;
  }
  local_31 = (undefined1)uVar8;
  __l._M_len = 8;
  __l._M_array = &local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_40,__l,&local_41);
  return pvVar9;
}

Assistant:

std::vector<uint8_t> Entity::to_bytes() const
{
    // Byte 0
    uint8_t byte0 = _attrs.position.x & 0x3F;
    byte0 |= (_attrs.orientation & 0x3) << 6;

    // Byte 1
    uint8_t byte1 = _attrs.position.y & 0x3F;
    byte1 |= ((_attrs.palette & 0x3) << 6);

    // Byte 2
    uint8_t byte2 = _attrs.speed & 0x07;
    if(_attrs.fightable)          byte2 |= 0x80;
    if(_attrs.liftable)           byte2 |= 0x40;
    if(_attrs.talkable)           byte2 |= 0x20;
    if(_attrs.flag_unknown_2_4)   byte2 |= 0x10;
    if(_attrs.flag_unknown_2_3)   byte2 |= 0x08;

    // Byte 3
    bool use_tiles_from_other_entity = (_attrs.entity_to_use_tiles_from != nullptr);
    uint8_t entity_id_to_use_tiles_from = 0;
    if(_attrs.entity_to_use_tiles_from)
        entity_id_to_use_tiles_from = _attrs.entity_to_use_tiles_from->entity_id();

    uint8_t byte3 = entity_id_to_use_tiles_from & 0x0F;
    if(_attrs.position.half_x)                 byte3 |= 0x80;
    if(_attrs.position.half_y)                 byte3 |= 0x40;
    if(_attrs.flag_unknown_3_5)            byte3 |= 0x20;
    if(use_tiles_from_other_entity)  byte3 |= 0x10;

    // Byte 4
    uint8_t byte4 = (_attrs.dialogue & 0x3F) << 2;
    byte4 |= (_attrs.behavior_id >> 8) & 0x3;

    // Byte 5
    uint8_t byte5 = _attrs.type_id;

    // Byte 6
    uint8_t byte6 = _attrs.position.z & 0x0F;
    if(_attrs.can_pass_through)   byte6 |= 0x10;
    if(_attrs.appear_after_player_moved_away)   byte6 |= 0x20;
    if(_attrs.position.half_z)        byte6 |= 0x40;
    if(_attrs.gravity_immune)   byte6 |= 0x80;

    // Byte 7
    uint8_t byte7 = _attrs.behavior_id & 0x00FF;

    return { byte0, byte1, byte2, byte3, byte4, byte5, byte6, byte7 };
}